

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psa_util.c
# Opt level: O1

int psa_status_to_mbedtls
              (psa_status_t status,mbedtls_error_pair_t *local_translations,size_t local_errors_num,
              _func_int_psa_status_t *fallback_f)

{
  long lVar1;
  int iVar2;
  ulong in_RAX;
  bool bVar3;
  
  bVar3 = local_errors_num != 0;
  if (bVar3) {
    if (local_translations->psa_status == status) {
      in_RAX = 0;
    }
    else {
      in_RAX = 0;
      do {
        if (local_errors_num - 1 == in_RAX) {
          bVar3 = false;
          goto LAB_002247a4;
        }
        lVar1 = in_RAX + 1;
        in_RAX = in_RAX + 1;
      } while (local_translations[lVar1].psa_status != status);
      bVar3 = in_RAX < local_errors_num;
    }
    in_RAX = (ulong)(uint)(int)local_translations[in_RAX].mbedtls_error;
  }
LAB_002247a4:
  if (bVar3) {
    return (int)in_RAX;
  }
  iVar2 = (*fallback_f)(status);
  return iVar2;
}

Assistant:

int psa_status_to_mbedtls(psa_status_t status,
                          const mbedtls_error_pair_t *local_translations,
                          size_t local_errors_num,
                          int (*fallback_f)(psa_status_t))
{
    for (size_t i = 0; i < local_errors_num; i++) {
        if (status == local_translations[i].psa_status) {
            return local_translations[i].mbedtls_error;
        }
    }
    return fallback_f(status);
}